

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::
OP_LdEnvSlot<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  Var pvVar1;
  
  pvVar1 = OP_LdFrameDisplaySlot(this,instance,(uint)playout->SlotIndex1);
  pvVar1 = OP_LdSlot(this,pvVar1,(uint)playout->SlotIndex2);
  return pvVar1;
}

Assistant:

Var InterpreterStackFrame::OP_LdEnvSlot(Var instance, const unaligned T* playout)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, playout->SlotIndex1);
        return OP_LdSlot(slotArray, playout->SlotIndex2);
    }